

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O0

char * __cxxabiv1::anon_unknown_0::parse_decltype<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  char *t;
  Db *in_stack_00000ff8;
  char *in_stack_00001000;
  char *in_stack_00001008;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *in_stack_ffffffffffffff18;
  vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
  *in_stack_ffffffffffffff20;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_stack_ffffffffffffff28;
  vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
  *in_stack_ffffffffffffff30;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  local_c8 [2];
  char *local_28;
  char *local_18;
  char *local_10;
  
  local_10 = in_RDI;
  if ((((3 < (long)in_RSI - (long)in_RDI) && (*in_RDI == 'D')) &&
      ((byte)(in_RDI[1] | 0x20U) == 0x74)) &&
     (((local_18 = in_RSI,
       local_28 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>
                            (in_stack_00001008,in_stack_00001000,in_stack_00000ff8),
       local_28 != local_10 + 2 && (local_28 != local_18)) && (*local_28 == 'E')))) {
    bVar1 = std::
            vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ::empty(in_stack_ffffffffffffff30);
    if (bVar1) {
      return local_10;
    }
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::back(in_stack_ffffffffffffff20);
    this = local_c8;
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(in_stack_ffffffffffffff18);
    std::operator+((char *)in_stack_ffffffffffffff28,&this->first);
    std::operator+(in_stack_ffffffffffffff28,(char *)this);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::string_pair(this,&in_stack_ffffffffffffff18->first);
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            *)this);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::operator=(this,in_stack_ffffffffffffff18);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::~string_pair(this);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                     *)0x1f2a98);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                     *)0x1f2aa2);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                     *)0x1f2aac);
    local_10 = local_28 + 1;
  }
  return local_10;
}

Assistant:

const char*
parse_decltype(const char* first, const char* last, C& db)
{
    if (last - first >= 4 && first[0] == 'D')
    {
        switch (first[1])
        {
        case 't':
        case 'T':
            {
                const char* t = parse_expression(first+2, last, db);
                if (t != first+2 && t != last && *t == 'E')
                {
                    if (db.names.empty())
                        return first;
                    db.names.back() = "decltype(" + db.names.back().move_full() + ")";
                    first = t+1;
                }
            }
            break;
        }
    }
    return first;
}